

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantUtil.cpp
# Opt level: O0

void vkt::pipeline::beginRenderPass
               (DeviceInterface *vk,VkCommandBuffer commandBuffer,VkRenderPass renderPass,
               VkFramebuffer framebuffer,VkRect2D *renderArea,Vec4 *clearColor)

{
  undefined4 local_88 [2];
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkClearValue clearValue;
  Vec4 *clearColor_local;
  VkRect2D *renderArea_local;
  VkCommandBuffer commandBuffer_local;
  DeviceInterface *vk_local;
  VkFramebuffer framebuffer_local;
  VkRenderPass renderPass_local;
  
  join_0x00000010_0x00000000_ = ::vk::makeClearValueColor(clearColor);
  local_88[0] = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  renderPassBeginInfo.framebuffer.m_internal = *(deUint64 *)&renderArea->offset;
  renderPassBeginInfo.renderArea.offset = *(VkOffset2D *)&renderArea->extent;
  renderPassBeginInfo.renderArea.extent.width = 1;
  renderPassBeginInfo._48_8_ = &renderPassBeginInfo.pClearValues;
  renderPassBeginInfo.pNext = (void *)renderPass.m_internal;
  renderPassBeginInfo.renderPass.m_internal = framebuffer.m_internal;
  (*vk->_vptr_DeviceInterface[0x74])(vk,commandBuffer,local_88,0);
  return;
}

Assistant:

void beginRenderPass (const DeviceInterface&	vk,
					  const VkCommandBuffer		commandBuffer,
					  const VkRenderPass		renderPass,
					  const VkFramebuffer		framebuffer,
					  const VkRect2D&			renderArea,
					  const tcu::Vec4&			clearColor)
{
	const VkClearValue clearValue = makeClearValueColor(clearColor);

	const VkRenderPassBeginInfo renderPassBeginInfo = {
		VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
		DE_NULL,										// const void*             pNext;
		renderPass,										// VkRenderPass            renderPass;
		framebuffer,									// VkFramebuffer           framebuffer;
		renderArea,										// VkRect2D                renderArea;
		1u,												// uint32_t                clearValueCount;
		&clearValue,									// const VkClearValue*     pClearValues;
	};

	vk.cmdBeginRenderPass(commandBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
}